

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_widgets.cpp
# Opt level: O2

bool QTest::qWaitForWindowExposed(QWidget *widget,int timeout)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  QWindow *pQVar4;
  nanoseconds nVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QWidget *widget_local;
  anon_class_1_0_00000001 local_71;
  anon_class_8_1_722b4b82 local_70;
  QDeadlineTimer local_68;
  QDeadlineTimer local_58;
  anon_class_16_2_bd42ce47 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70.widget = &widget_local;
  widget_local = widget;
  pQVar4 = qWaitForWindowExposed::anon_class_8_1_722b4b82::operator()(&local_70);
  if (pQVar4 == (QWindow *)0x0) {
    bVar3 = false;
  }
  else {
    QDeadlineTimer::QDeadlineTimer(&local_68,(long)timeout,PreciseTimer);
    local_48.predicate = &local_71;
    local_58.t1 = local_68.t1;
    local_58.t2 = local_68.t2;
    local_58.type = local_68.type;
    local_48.windowGetter = &local_70;
    bVar1 = qWaitForWidgetWindow<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/kernel/qtestsupport_widgets.cpp:105:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/kernel/qtestsupport_widgets.cpp:106:33),_int>
            ::anon_class_16_2_bd42ce47::operator()(&local_48);
    bVar3 = true;
    if (!bVar1) {
      do {
        QCoreApplication::processEvents();
        QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
        bVar1 = qWaitForWidgetWindow<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/kernel/qtestsupport_widgets.cpp:105:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/kernel/qtestsupport_widgets.cpp:106:33),_int>
                ::anon_class_16_2_bd42ce47::operator()(&local_48);
        if (bVar1) goto LAB_002ecc7b;
        nVar5 = QDeadlineTimer::remainingTimeAsDuration(&local_58);
        if (0 < nVar5.__r) {
          uVar6 = (ulong)nVar5.__r / 1000000 +
                  (ulong)(((ulong)nVar5.__r / 1000000) * 1000000 < (ulong)nVar5.__r);
          if (9 < uVar6) {
            uVar6 = 10;
          }
          QTest::qSleep(uVar6);
        }
        cVar2 = QDeadlineTimer::hasExpired();
      } while (cVar2 == '\0');
      bVar3 = qWaitForWidgetWindow<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/kernel/qtestsupport_widgets.cpp:105:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/kernel/qtestsupport_widgets.cpp:106:33),_int>
              ::anon_class_16_2_bd42ce47::operator()(&local_48);
    }
  }
LAB_002ecc7b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

Q_WIDGETS_EXPORT bool QTest::qWaitForWindowExposed(QWidget *widget, int timeout)
{
    return qWaitForWidgetWindow([&]() { return widget->window()->windowHandle(); },
                                [&](QWindow *window) { return window->isExposed(); },
                                timeout);
}